

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::Dequeue(Worker *this)

{
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  *this_00;
  _Map_pointer ppuVar1;
  size_t sVar2;
  Request *pRVar3;
  __uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_> _Var4;
  pointer __p;
  _Map_pointer ppuVar5;
  size_t sVar6;
  _Elt_pointer puVar7;
  _Elt_pointer puVar8;
  _Elt_pointer puVar9;
  _Elt_pointer puVar10;
  _Map_pointer ppuVar11;
  bool bVar12;
  int iVar13;
  CURLMcode err;
  ulong uVar14;
  __uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *this_01;
  CurlException *this_02;
  long lVar15;
  ulong uVar16;
  _Elt_pointer puVar17;
  _Map_pointer ppuVar18;
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  *pdVar19;
  _Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  *p_Var20;
  _Elt_pointer __args;
  _Elt_pointer puVar21;
  unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *puVar22;
  _Map_pointer ppuVar23;
  byte bVar24;
  iterator local_108;
  string local_e8;
  _Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  local_c8;
  iterator local_70;
  iterator local_50;
  
  bVar24 = 0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::_M_initialize_map(&local_c8,0);
  iVar13 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  ppuVar11 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  puVar10 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_last;
  puVar9 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_first;
  puVar8 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppuVar23 = local_c8._M_impl.super__Deque_impl_data._M_start._M_node;
  puVar21 = local_c8._M_impl.super__Deque_impl_data._M_start._M_last;
  puVar17 = local_c8._M_impl.super__Deque_impl_data._M_start._M_first;
  puVar7 = local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  sVar6 = local_c8._M_impl.super__Deque_impl_data._M_map_size;
  ppuVar5 = local_c8._M_impl.super__Deque_impl_data._M_map;
  if (iVar13 == 0) {
    ppuVar1 = (this->queue_).
              super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppuVar18 = (this->queue_).
               super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    this_00 = &this->queue_;
    __args = (this->queue_).
             super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar22 = (this->queue_).
              super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    uVar14 = ((long)puVar22 - (long)__args >> 3) +
             ((long)(this->queue_).
                    super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->queue_).
                    super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppuVar1 - (long)ppuVar18) >> 3) - 1) +
             (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40;
    sVar2 = (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (uVar14 + sVar2 < 0x21) {
      local_108._M_cur = (_Elt_pointer)local_c8._M_impl.super__Deque_impl_data._M_map;
      local_108._M_first = (_Elt_pointer)local_c8._M_impl.super__Deque_impl_data._M_map_size;
      pdVar19 = this_00;
      p_Var20 = &local_c8;
      for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
        (p_Var20->_M_impl).super__Deque_impl_data._M_map =
             (pdVar19->
             super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
             )._M_impl.super__Deque_impl_data._M_map;
        pdVar19 = (deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                   *)((long)pdVar19 + (ulong)bVar24 * -0x10 + 8);
        p_Var20 = (_Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                   *)((long)p_Var20 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      (this_00->
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      )._M_impl.super__Deque_impl_data._M_map = ppuVar5;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = sVar6;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = puVar7;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = puVar17;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = puVar21;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = ppuVar23;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar8;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = puVar9;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = puVar10;
      (this->queue_).
      super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = ppuVar11;
      std::
      deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ::clear(this_00);
      bVar12 = false;
    }
    else {
      uVar16 = 0x20 - sVar2;
      if (uVar14 < 0x20 - sVar2) {
        uVar16 = uVar14;
      }
      if (uVar16 == 0) {
        bVar12 = true;
        if (sVar2 != 0x20) goto LAB_0011c6e2;
      }
      else {
        do {
          if (__args == (this->queue_).
                        super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            __assert_fail("it != queue_.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                          ,0x37e,"void restincurl::Worker::Dequeue()");
          }
          if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::
            deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
            ::
            _M_push_back_aux<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>
                      ((deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
                        *)&local_c8,__args);
          }
          else {
            ((local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->_M_t).
            super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
            _M_t.
            super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
            .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl =
                 (__args->_M_t).
                 super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
                 .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
            (__args->_M_t).
            super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
            _M_t.
            super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
            .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl = (Request *)0x0;
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          __args = __args + 1;
          if (__args == puVar22) {
            __args = ppuVar18[1];
            ppuVar18 = ppuVar18 + 1;
            puVar22 = __args + 0x40;
          }
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        local_108._M_cur =
             (this->queue_).
             super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_108._M_node =
             (this->queue_).
             super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
        local_108._M_first = *local_108._M_node;
        local_108._M_last = local_108._M_first + 0x40;
        local_50._M_first = *ppuVar18;
        local_50._M_last = local_50._M_first + 0x40;
        local_50._M_cur = __args;
        local_50._M_node = ppuVar18;
        std::
        deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
        ::_M_erase(&local_70,this_00,&local_108,&local_50);
        bVar12 = true;
      }
    }
    this->pending_entries_in_queue_ = bVar12;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    puVar7 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur !=
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      puVar17 = local_c8._M_impl.super__Deque_impl_data._M_start._M_last;
      puVar21 = local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppuVar23 = local_c8._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        pRVar3 = (puVar21->_M_t).
                 super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
                 .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
        if (pRVar3 == (Request *)0x0) {
          __assert_fail("req",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x38d,"void restincurl::Worker::Dequeue()");
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
        .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl =
             *(tuple<restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_> *)
              &(pRVar3->eh_)._M_t;
        if ((__uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>)
            _Var4._M_t.
            super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
            .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>)
            0x0) {
          __assert_fail("eh_",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x1fb,"EasyHandle &restincurl::Request::GetEasyHandle()");
        }
        local_108._M_cur =
             *(_Elt_pointer *)
              _Var4._M_t.
              super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
              .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl;
        this_01 = (__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *
                  )std::
                   map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
                   ::operator[](&this->ongoing_,&local_108._M_cur);
        __p = (puVar21->_M_t).
              super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
              _M_t.
              super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
              .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
        (puVar21->_M_t).
        super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
        super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
        super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl = (Request *)0x0;
        std::__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>::reset
                  (this_01,__p);
        err = curl_multi_add_handle
                        (this->handle_,
                         *(undefined8 *)
                          _Var4._M_t.
                          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl);
        if (err != CURLM_OK) {
          this_02 = (CurlException *)__cxa_allocate_exception(0x18);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"curl_multi_add_handle","");
          CurlException::CurlException(this_02,&local_e8,err);
          __cxa_throw(this_02,&CurlException::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar21 = puVar21 + 1;
        if (puVar21 == puVar17) {
          puVar21 = ppuVar23[1];
          ppuVar23 = ppuVar23 + 1;
          puVar17 = puVar21 + 0x40;
        }
      } while (puVar21 != puVar7);
    }
    std::
    deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
    ::~deque((deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
              *)&local_c8);
    return;
  }
  std::__throw_system_error(iVar13);
LAB_0011c6e2:
  __assert_fail("ongoing_.size() == RESTINCURL_MAX_CONNECTIONS",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,900,"void restincurl::Worker::Dequeue()");
}

Assistant:

void Dequeue() {
            decltype(queue_) tmp;

            {
                lock_t lock(mutex_);
                if ((queue_.size() + ongoing_.size()) <= RESTINCURL_MAX_CONNECTIONS) {
                    tmp = std::move(queue_);
                    pending_entries_in_queue_ = false;
                } else {
                    auto remains = std::min<size_t>(RESTINCURL_MAX_CONNECTIONS - ongoing_.size(), queue_.size());
                    if (remains) {
                        auto it = queue_.begin();
                        RESTINCURL_LOG_TRACE("Adding only " << remains << " of " << queue_.size()
                            << " requests from queue: << RESTINCURL_MAX_CONNECTIONS=" << RESTINCURL_MAX_CONNECTIONS);
                        while(remains--) {
                            assert(it != queue_.end());
                            tmp.push_back(std::move(*it));
                            ++it;
                        }
                        queue_.erase(queue_.begin(), it);
                    } else {
                        assert(ongoing_.size() == RESTINCURL_MAX_CONNECTIONS);
                        RESTINCURL_LOG_TRACE("Adding no entries from queue: RESTINCURL_MAX_CONNECTIONS="
                            << RESTINCURL_MAX_CONNECTIONS);
                    }
                    pending_entries_in_queue_ = true;
                }
            }

            for(auto& req: tmp) {
                assert(req);
                const auto& eh = req->GetEasyHandle();
                RESTINCURL_LOG_TRACE("Adding request: " << eh);
                ongoing_[eh] = std::move(req);
                const auto mc = curl_multi_add_handle(handle_, eh);
                if (mc != CURLM_OK) {
                    throw CurlException("curl_multi_add_handle", mc);
                }
            }
        }